

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::ComputeLessThanRange::operator()
          (ComputeLessThanRange *this,Random *rnd,bool dstMin,bool dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  deUint32 dVar1;
  float aLen;
  float fVar2;
  float fVar3;
  float fVar4;
  
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  fVar2 = (float)(dVar1 % 0x21) * 0.25 + 0.0;
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  fVar4 = (float)(dVar1 % 0x21) * 0.25 + -4.0;
  fVar3 = fVar2 + fVar4;
  if (dstMax && !dstMin) {
    *aMin = fVar4;
    *aMax = fVar3;
  }
  else {
    dVar1 = deRandom_getUint32(&rnd->m_rnd);
    fVar2 = (float)(int)(dVar1 % ((int)((8.0 - fVar2) * 4.0) + 1U)) * 0.25 + 0.0;
    if (dstMin && dstMax) {
      *aMax = fVar4 + -0.25;
      *aMin = (fVar4 + -0.25) - fVar2;
    }
    else {
      *aMin = fVar3;
      *aMax = fVar2 + fVar3;
    }
  }
  *bMin = fVar4;
  *bMax = fVar3;
  return;
}

Assistant:

void ComputeLessThanRange::operator () (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
		float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, getStep<float>()); }
	};

	// One random range
	T	rLen	= GetRandom()(rnd, T(0), T(8));
	T	rMin	= GetRandom()(rnd, T(-4), T(4));
	T	rMax	= rMin+rLen;

	if (dstMin == false && dstMax == true)
	{
		// Both values are possible, use same range for both inputs
		aMin	= rMin;
		aMax	= rMax;
		bMin	= rMin;
		bMax	= rMax;
	}
	else if (dstMin == true && dstMax == true)
	{
		// Compute range that is less than rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMax	= rMin - getStep<T>();
		aMin	= aMax - aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
	else
	{
		// Compute range that is greater than or equal to rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMin	= rMax;
		aMax	= aMin + aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
}